

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::addGlobalOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  MainBuilder *this_00;
  Type *in_RCX;
  Type *func;
  Type *in_R8;
  ArrayPtr<const_char> local_f8;
  undefined1 local_e2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47)>
  local_e0;
  Function<kj::MainBuilder::Validity_()> local_d0;
  OptionName local_c0 [2];
  StringPtr local_a0 [2];
  StringPtr local_80;
  undefined1 local_6a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52)>
  local_68;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_58;
  OptionName local_48;
  OptionName local_38 [2];
  undefined8 local_18;
  MainBuilder *builder_local;
  CompilerMain *this_local;
  
  local_18 = builder;
  builder_local = (MainBuilder *)this;
  kj::MainBuilder::OptionName::OptionName(&local_48,'I');
  kj::MainBuilder::OptionName::OptionName(local_38,"import-path");
  local_38[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_38[1]._0_8_ = &local_48;
  local_68.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:286:52)>
                           *)this,(_ *)(local_6a + 1),(CompilerMain *)local_6a,in_RCX,in_R8);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_58,&local_68);
  kj::StringPtr::StringPtr(&local_80,"<dir>");
  kj::StringPtr::StringPtr
            (local_a0,
             "Add <dir> to the list of directories searched for non-relative imports (ones that start with a \'/\')."
            );
  names_00._M_len = (size_type)local_38[1].field_1;
  names_00._M_array = (iterator)local_38[1]._0_8_;
  argumentTitle.content.size_ = local_80.content.size_;
  argumentTitle.content.ptr = local_80.content.ptr;
  func = (Type *)&local_58;
  helpText.content.size_ = local_a0[0].content.size_;
  helpText.content.ptr = local_a0[0].content.ptr;
  this_00 = kj::MainBuilder::addOptionWithArg
                      (builder,names_00,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func,
                       argumentTitle,helpText);
  kj::MainBuilder::OptionName::OptionName(local_c0,"no-standard-import");
  local_c0[1]._0_8_ = local_c0;
  local_c0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_e0.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:289:47)>
                           *)this,(_ *)(local_e2 + 1),(CompilerMain *)local_e2,func,
                          (Type *)local_80.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_d0,&local_e0);
  kj::StringPtr::StringPtr
            ((StringPtr *)&local_f8,
             "Do not add any default import paths; use only those specified by -I.  Otherwise, typically /usr/include and /usr/local/include are added by default."
            );
  names._M_len = (size_type)local_c0[1].field_1;
  names._M_array = (iterator)local_c0[1]._0_8_;
  kj::MainBuilder::addOption(this_00,names,&local_d0,(StringPtr)local_f8);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_d0);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_58);
  return;
}

Assistant:

void addGlobalOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'I', "import-path"}, KJ_BIND_METHOD(*this, addImportPath), "<dir>",
                             "Add <dir> to the list of directories searched for non-relative "
                             "imports (ones that start with a '/').")
           .addOption({"no-standard-import"}, KJ_BIND_METHOD(*this, noStandardImport),
                      "Do not add any default import paths; use only those specified by -I.  "
                      "Otherwise, typically /usr/include and /usr/local/include are added by "
                      "default.");
  }